

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

void despot::AEMS::Expand
               (QNode *qnode,BeliefLowerBound *lb,BeliefUpperBound *ub,BeliefMDP *model,
               History *history)

{
  double dVar1;
  QNode *this;
  uint uVar2;
  int iVar3;
  int iVar4;
  VNode *pVVar5;
  Belief *pBVar6;
  log_ostream *plVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  mapped_type *ppVVar9;
  _Base_ptr p_Var10;
  History *history_00;
  History *history_01;
  _Self __tmp;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  OBS_TYPE obs;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  obss;
  OBS_TYPE local_110;
  uint local_104;
  QNode *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Base_ptr local_e8;
  undefined8 uStack_e0;
  BeliefUpperBound *local_d0;
  BeliefLowerBound *local_c8;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_c0;
  VNode *local_b8;
  BeliefMDP *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  local_60;
  
  local_d0 = ub;
  local_c8 = lb;
  pVVar5 = QNode::parent(qnode);
  local_104 = QNode::edge(qnode);
  local_c0 = QNode::children(qnode);
  local_b8 = pVVar5;
  pBVar6 = VNode::belief(pVVar5);
  uVar2 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1e])(model,pBVar6,(ulong)uVar2);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100 = qnode;
  local_a8 = extraout_XMM0_Da;
  uStack_a4 = extraout_XMM0_Db;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar2 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1d])(model,pBVar6,(ulong)uVar2,&local_60);
  local_f8 = (double)CONCAT44(uStack_a4,local_a8);
  uStack_f0 = (double)CONCAT44(uStack_a4,local_a8);
  local_b0 = model;
  for (p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left; this = local_100,
      (_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    local_110 = *(OBS_TYPE *)(p_Var10 + 1);
    local_e8 = p_Var10[1]._M_parent;
    uStack_e0 = 0;
    iVar3 = logging::level();
    if (0 < iVar3) {
      iVar3 = logging::level();
      if (3 < iVar3) {
        plVar7 = logging::stream(4);
        poVar8 = std::operator<<(&plVar7->super_ostream,"[AEMS::Expand] Creating node for obs ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::operator<<(poVar8," with weight ");
        poVar8 = std::ostream::_M_insert<double>((double)local_e8);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    pVVar5 = (VNode *)operator_new(0x98);
    iVar3 = (*(local_b0->super_DSPOMDP)._vptr_DSPOMDP[0x1c])
                      (local_b0,pBVar6,(ulong)local_104,local_110);
    iVar4 = VNode::depth(local_b8);
    VNode::VNode(pVVar5,(Belief *)CONCAT44(extraout_var,iVar3),iVar4 + 1,local_100,local_110);
    pVVar5->likelihood = (double)local_e8;
    iVar3 = logging::level();
    if (0 < iVar3) {
      iVar3 = logging::level();
      if (3 < iVar3) {
        plVar7 = logging::stream(4);
        poVar8 = std::operator<<(&plVar7->super_ostream," New node created!");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
    ppVVar9 = std::
              map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
              ::operator[](local_c0,&local_110);
    *ppVVar9 = pVVar5;
    InitLowerBound(pVVar5,local_c8,history_00);
    InitUpperBound(pVVar5,local_d0,history_01);
    local_78 = DAT_0019fdd8;
    uStack_70 = 0;
    dVar1 = VNode::lower_bound(pVVar5);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = dVar1;
    local_88._12_4_ = extraout_XMM0_Dd;
    local_98 = DAT_0019fdd8;
    uStack_90 = DAT_0019fde0;
    dVar1 = VNode::upper_bound(pVVar5);
    local_f8 = local_f8 + dVar1 * local_98 * (double)local_e8;
    uStack_f0 = uStack_f0 + (double)local_88._0_8_ * local_78 * (double)local_e8;
  }
  local_100->step_reward = (double)CONCAT44(uStack_a4,local_a8);
  QNode::lower_bound(local_100,uStack_f0);
  QNode::upper_bound(this,local_f8);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void AEMS::Expand(QNode* qnode, BeliefLowerBound* lb, BeliefUpperBound* ub,
	const BeliefMDP* model, History& history) {
	VNode* parent = qnode->parent();
	ACT_TYPE action = qnode->edge();
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const Belief* belief = parent->belief();
	// cout << *belief << endl;

	double step_reward = model->StepReward(belief, qnode->edge());

	map<OBS_TYPE, double> obss;
	model->Observe(belief, qnode->edge(), obss);

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, double>::iterator it = obss.begin(); it != obss.end(); it++) {
		OBS_TYPE obs = it->first;
		double weight = it->second;
		logd << "[AEMS::Expand] Creating node for obs " << obs
			<< " with weight " << weight << endl;
		VNode* vnode = new VNode(model->Tau(belief, action, obs),
			parent->depth() + 1, qnode, obs);
		vnode->likelihood = weight;
		logd << " New node created!" << endl;
		children[obs] = vnode;

		InitLowerBound(vnode, lb, history);
		InitUpperBound(vnode, ub, history);

		lower_bound += weight * Globals::Discount() * vnode->lower_bound();
		upper_bound += weight * Globals::Discount() * vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
}